

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O3

int QUtf8::compareUtf8(QByteArrayView lhs,QByteArrayView rhs,CaseSensitivity cs)

{
  int iVar1;
  char32_t cVar2;
  char32_t cVar3;
  byte *__s2;
  byte *pbVar4;
  size_t sVar5;
  size_t __n;
  byte *__s1;
  size_t sVar6;
  byte *pbVar7;
  bool bVar8;
  bool bVar9;
  
  __s1 = (byte *)lhs.m_data;
  sVar6 = lhs.m_size;
  __s2 = (byte *)rhs.m_data;
  sVar5 = rhs.m_size;
  if (sVar6 == 0) {
    bVar9 = (long)sVar5 < 0;
    bVar8 = sVar5 == 0;
  }
  else {
    if (cs != CaseSensitive) {
      pbVar4 = __s2;
      pbVar7 = __s1;
      do {
        if ((__s1 + sVar6 <= pbVar7) || (__s2 + sVar5 <= pbVar4)) {
          return (uint)(pbVar7 < __s1 + sVar6) - (uint)(pbVar4 < __s2 + sVar5);
        }
        cVar2 = (char32_t)*pbVar7;
        if ((char)*pbVar7 < '\0') {
          cVar2 = L'�';
        }
        cVar3 = (char32_t)*pbVar4;
        if ((char)*pbVar4 < '\0') {
          cVar3 = L'�';
        }
        cVar2 = QChar::toCaseFolded(cVar2);
        cVar3 = QChar::toCaseFolded(cVar3);
        pbVar4 = pbVar4 + 1;
        pbVar7 = pbVar7 + 1;
      } while (cVar2 - cVar3 == 0);
      return cVar2 - cVar3;
    }
    __n = sVar6;
    if ((long)sVar5 < (long)sVar6) {
      __n = sVar5;
    }
    iVar1 = memcmp(__s1,__s2,__n);
    if (iVar1 != 0) {
      return iVar1;
    }
    bVar8 = sVar5 == sVar6;
    bVar9 = (long)sVar5 < (long)sVar6;
  }
  iVar1 = (uint)bVar9 * 2 + -1;
  if (bVar8) {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int QUtf8::compareUtf8(QByteArrayView lhs, QByteArrayView rhs, Qt::CaseSensitivity cs) noexcept
{
    if (lhs.isEmpty())
        return qt_lencmp(0, rhs.size());

    if (cs == Qt::CaseSensitive) {
        const auto l = std::min(lhs.size(), rhs.size());
        int r = memcmp(lhs.data(), rhs.data(), l);
        return r ? r : qt_lencmp(lhs.size(), rhs.size());
    }

    char32_t uc1 = QChar::Null;
    auto src1 = reinterpret_cast<const uchar *>(lhs.data());
    auto end1 = src1 + lhs.size();
    char32_t uc2 = QChar::Null;
    auto src2 = reinterpret_cast<const uchar *>(rhs.data());
    auto end2 = src2 + rhs.size();

    while (src1 < end1 && src2 < end2) {
        uchar b = *src1++;
        char32_t *output = &uc1;
        qsizetype res = QUtf8Functions::fromUtf8<QUtf8BaseTraits>(b, output, src1, end1);
        if (res < 0) {
            // decoding error
            uc1 = QChar::ReplacementCharacter;
        }

        b = *src2++;
        output = &uc2;
        res = QUtf8Functions::fromUtf8<QUtf8BaseTraits>(b, output, src2, end2);
        if (res < 0) {
            // decoding error
            uc2 = QChar::ReplacementCharacter;
        }

        uc1 = QChar::toCaseFolded(uc1);
        uc2 = QChar::toCaseFolded(uc2);
        if (uc1 != uc2)
            return int(uc1) - int(uc2);
    }

    // the shorter string sorts first
    return (end1 > src1) - (end2 > src2);
}